

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int vrna_params_load(char *fname,uint options)

{
  int iVar1;
  FILE *__stream;
  void *p;
  char *pcVar2;
  char **file_content;
  long lVar3;
  char **ppcVar4;
  uint size;
  long lVar5;
  
  __stream = fopen(fname,"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
    vrna_message_warning("read_parameter_file():Can\'t open file %s\n",fname);
  }
  else {
    size = 0x40000;
    p = vrna_alloc(0x40000);
    lVar3 = 0x8000;
    lVar5 = 0;
    while( true ) {
      pcVar2 = vrna_read_line((FILE *)__stream);
      if (pcVar2 == (char *)0x0) break;
      if (lVar5 == lVar3) {
        lVar3 = lVar5 + 0x8000;
        p = vrna_realloc(p,size);
      }
      *(char **)((long)p + lVar5 * 8) = pcVar2;
      lVar5 = lVar5 + 1;
      size = size + 8;
    }
    file_content = (char **)vrna_realloc(p,size - 0x3fff8);
    file_content[lVar5] = (char *)0x0;
    fclose(__stream);
    pcVar2 = vrna_basename(fname);
    iVar1 = set_parameters_from_string(file_content,pcVar2);
    free(pcVar2);
    for (ppcVar4 = file_content; *ppcVar4 != (char *)0x0; ppcVar4 = ppcVar4 + 1) {
      free(*ppcVar4);
    }
    free(file_content);
  }
  return iVar1;
}

Assistant:

PUBLIC int
vrna_params_load(const char   fname[],
                 unsigned int options)
{
  char  *name, **file_content, **ptr;
  int   ret;

  ret           = 0;
  file_content  = file2array(fname);

  if (file_content) {
    name = vrna_basename(fname);

    ret = set_parameters_from_string(file_content,
                                     (const char *)name);

    free(name);
    for (ptr = file_content; *ptr != NULL; ptr++)
      free(*ptr);

    free(file_content);
  }

  return ret;
}